

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_counting.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int i;
  long lVar4;
  int arr [12551];
  undefined8 uStack_340;
  int local_338 [200];
  
  iVar3 = 0;
  do {
    lVar4 = 0;
    do {
      uStack_340 = (code *)0x1022ac;
      iVar1 = rand();
      local_338[lVar4] = iVar1 % 10;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 200);
    uStack_340 = (code *)0x1022e6;
    counting_sort<int>(local_338,200);
    lVar4 = 4;
    do {
      lVar2 = lVar4;
      if (lVar2 == 800) goto LAB_0010230c;
      lVar4 = lVar2 + 4;
    } while (*(int *)((long)local_338 + lVar2 + -4) <= *(int *)((long)local_338 + lVar2));
    if (lVar2 != 800) {
      uStack_340 = counting_sort<int>;
      __assert_fail("std::is_sorted(arr, arr + n)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wasimusu[P]cpp_algorithms/sorting/sort_counting.cpp"
                    ,0x28,"int main()");
    }
LAB_0010230c:
    iVar3 = iVar3 + 1;
    if (iVar3 == 100) {
      uStack_340 = (code *)0x10232d;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Successfully sorted using counting sort! \n",0x2a);
      return 0;
    }
  } while( true );
}

Assistant:

int main() {
    int n = 200;
    int arr[n];
    for (int _ = 0; _ < 100; _++) {
        generate_random_arrs(arr, n);
        counting_sort(arr, n);
        assert(std::is_sorted(arr, arr + n));
    }
    std::cout << "Successfully sorted using counting sort! \n";
    return 0;
}